

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

void ImNodes::EndSlot(void)

{
  float val;
  ImGuiStorage *this;
  ImGuiWindow *window;
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Pair *pPVar4;
  long lVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  bool bVar8;
  ImGuiID IVar9;
  ImU32 IVar10;
  int iVar11;
  ImGuiPayload *pIVar12;
  ImGuiStorage *pIVar13;
  ImRect *pIVar14;
  char drag_id [32];
  ImRect slot_rect;
  float local_88;
  float fStack_84;
  char local_78 [32];
  undefined1 local_58 [12];
  float fStack_4c;
  ImVec2 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  ImGui::GetStyle();
  lVar5 = gCanvas;
  this = *(ImGuiStorage **)(gCanvas + 0x98);
  ImGui::EndGroup();
  pIVar13 = this + 3;
  ImGui::PushID(*(char **)&this[3].Data);
  ImGui::PushID(*(int *)&this[2].Data.Data);
  IVar6 = ImGui::GetItemRectMin();
  IVar7 = ImGui::GetItemRectMax();
  local_88 = IVar6.x;
  fStack_84 = IVar6.y;
  local_58._8_4_ = IVar7.x;
  fStack_4c = IVar7.y;
  local_58._0_4_ = local_88;
  local_58._4_4_ = fStack_84;
  IVar9 = ImGui::GetID(*(char **)&this[3].Data);
  ImGui::ItemAdd((ImRect *)local_58,IVar9,(ImRect *)0x0);
  bVar8 = ImGui::IsMouseClicked(0,false);
  if (bVar8) {
    bVar8 = ImGui::IsItemHovered(0);
    if (bVar8) {
      IVar9 = ImGui::GetID(*(char **)&pIVar13->Data);
      window = GImGui->CurrentWindow;
      window->WriteAccessed = true;
      ImGui::SetActiveID(IVar9,window);
    }
  }
  bVar8 = ImGui::IsItemActive();
  if (bVar8) {
    bVar8 = ImGui::IsMouseDown(0);
    if (!bVar8) {
      ImGui::ClearActiveID();
    }
  }
  iVar11 = *(int *)&this[2].Data.Data;
  pIVar14 = (ImRect *)local_58;
  if (-1 < iVar11) {
    pIVar14 = (ImRect *)(local_58 + 8);
  }
  val = (pIVar14->Min).x;
  IVar10 = MakeSlotDataID("x",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)iVar11 >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar10,val);
  IVar10 = MakeSlotDataID("y",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)*(undefined4 *)&this[2].Data.Data >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar10,(fStack_4c - (float)local_58._4_4_) * -0.5 + fStack_4c);
  bVar8 = ImGui::BeginDragDropSource(0);
  if (!bVar8) goto LAB_00154cab;
  pIVar12 = ImGui::GetDragDropPayload();
  snprintf(local_78,0x20,"new-node-connection-%08X");
  if ((pIVar12 == (ImGuiPayload *)0x0) || (pIVar12->DataFrameCount == -1)) {
LAB_00154c2e:
    local_48 = *(ImVec2 *)(this + 1);
    local_38 = (ulong)*(uint *)&this[2].Data.Data;
    uStack_40._0_4_ = this[3].Data.Size;
    uStack_40._4_4_ = this[3].Data.Capacity;
    ImGui::SetDragDropPayload(local_78,&local_48,0x18,0);
    this[4].Data.Size = 0;
    this[4].Data.Capacity = 0;
    this[4].Data.Data = (Pair *)0x0;
    this[5].Data.Size = 0;
    this[5].Data.Capacity = 0;
    this[5].Data.Data = (Pair *)0x0;
    lVar1 = *(long *)(lVar5 + 0x98);
    if (*(void **)(lVar1 + 0xa0) != (void *)0x0) {
      *(undefined8 *)(lVar1 + 0x98) = 0;
      ImGui::MemFree(*(void **)(lVar1 + 0xa0));
      *(undefined8 *)(lVar1 + 0xa0) = 0;
    }
  }
  else {
    iVar11 = strcmp(local_78,pIVar12->DataType);
    if (iVar11 != 0) goto LAB_00154c2e;
  }
  ImGui::TextUnformatted(*(char **)&pIVar13->Data,(char *)0x0);
  ImGui::EndDragDropSource();
LAB_00154cab:
  bVar8 = IsConnectingCompatibleSlot();
  if (bVar8) {
    bVar8 = ImGui::BeginDragDropTarget();
    if (bVar8) {
      snprintf(local_78,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)&this[2].Data.Data);
      pIVar12 = ImGui::AcceptDragDropPayload(local_78,0);
      if (pIVar12 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar12->Data;
        if (*(int *)&this[2].Data.Data < 0) {
          iVar11 = this[1].Data.Capacity;
          pPVar4 = *(Pair **)&this[3].Data;
          this[4].Data.Size = this[1].Data.Size;
          this[4].Data.Capacity = iVar11;
          this[4].Data.Data = pPVar4;
          uVar3 = *puVar2;
          this[5].Data.Size = (int)uVar3;
          this[5].Data.Capacity = (int)((ulong)uVar3 >> 0x20);
          pIVar13 = (ImGuiStorage *)(puVar2 + 1);
        }
        else {
          uVar3 = *puVar2;
          this[4].Data.Size = (int)uVar3;
          this[4].Data.Capacity = (int)((ulong)uVar3 >> 0x20);
          this[4].Data.Data = (Pair *)puVar2[1];
          iVar11 = this[1].Data.Capacity;
          this[5].Data.Size = this[1].Data.Size;
          this[5].Data.Capacity = iVar11;
        }
        this[5].Data.Data = *(Pair **)&pIVar13->Data;
        *(undefined1 *)&this[8].Data.Data = 1;
        lVar5 = *(long *)(lVar5 + 0x98);
        if (*(void **)(lVar5 + 0xa0) != (void *)0x0) {
          *(undefined8 *)(lVar5 + 0x98) = 0;
          ImGui::MemFree(*(void **)(lVar5 + 0xa0));
          *(undefined8 *)(lVar5 + 0xa0) = 0;
        }
      }
      ImGui::EndDragDropTarget();
    }
  }
  ImGui::PopID();
  ImGui::PopID();
  return;
}

Assistant:

void EndSlot()
{
    const ImGuiStyle& style = ImGui::GetStyle();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    ImGui::EndGroup();

    ImGui::PushID(impl->slot.title);
    ImGui::PushID(impl->slot.kind);

    ImRect slot_rect{ImGui::GetItemRectMin(), ImGui::GetItemRectMax()};
    // This here adds extra line between slots because after user renders slot cursor is already past those items.
    // ImGui::ItemSize(slot_rect.GetSize());
    ImGui::ItemAdd(slot_rect, ImGui::GetID(impl->slot.title));

    if (ImGui::IsMouseClicked(0) && ImGui::IsItemHovered())
        ImGui::SetActiveID(ImGui::GetID(impl->slot.title), ImGui::GetCurrentWindow());

    if (ImGui::IsItemActive() && !ImGui::IsMouseDown(0))
        ImGui::ClearActiveID();

    // Store slot edge positions, curves will connect there
    {
        float x;
        if (IsInputSlotKind(impl->slot.kind))
            x = slot_rect.Min.x;
        else
            x = slot_rect.Max.x;

        impl->cached_data.SetFloat(MakeSlotDataID("x", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)), x);
        impl->cached_data.SetFloat(MakeSlotDataID("y", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)),
            slot_rect.Max.y - slot_rect.GetHeight() / 2);
    }

    if (ImGui::BeginDragDropSource())
    {
        auto* payload = ImGui::GetDragDropPayload();
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind);
        if (payload == nullptr || !payload->IsDataType(drag_id))
        {
            _DragConnectionPayload drag_data{ };
            drag_data.node_id = impl->node.id;
            drag_data.slot_kind = impl->slot.kind;
            drag_data.slot_title = impl->slot.title;

            ImGui::SetDragDropPayload(drag_id, &drag_data, sizeof(drag_data));

            // Clear new connection info
            impl->new_connection.input_node = nullptr;
            impl->new_connection.input_slot = nullptr;
            impl->new_connection.output_node = nullptr;
            impl->new_connection.output_slot = nullptr;
            canvas->_impl->ignore_connections.clear();
        }
        ImGui::TextUnformatted(impl->slot.title);
        ImGui::EndDragDropSource();
    }

    if (IsConnectingCompatibleSlot() && ImGui::BeginDragDropTarget())
    {
        // Accept drags from opposite type (input <-> output, and same kind)
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);

        if (auto* payload = ImGui::AcceptDragDropPayload(drag_id))
        {
            auto* drag_data = (_DragConnectionPayload*) payload->Data;

            // Store info of source slot to be queried by ImNodes::GetConnection()
            if (!IsInputSlotKind(impl->slot.kind))
            {
                impl->new_connection.input_node = drag_data->node_id;
                impl->new_connection.input_slot = drag_data->slot_title;
                impl->new_connection.output_node = impl->node.id;
                impl->new_connection.output_slot = impl->slot.title;
            }
            else
            {
                impl->new_connection.input_node = impl->node.id;
                impl->new_connection.input_slot = impl->slot.title;
                impl->new_connection.output_node = drag_data->node_id;
                impl->new_connection.output_slot = drag_data->slot_title;
            }
            impl->just_connected = true;
            canvas->_impl->ignore_connections.clear();
        }

        ImGui::EndDragDropTarget();
    }

    ImGui::PopID(); // kind
    ImGui::PopID(); // name
}